

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

void __thiscall sophia_interface::LUEDIT(sophia_interface *this,int MEDIT)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  sophia_interface *psVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  int IS_2;
  int KC_4;
  int I_9;
  int IS_1;
  int KC_3;
  int I_8;
  int IS;
  int KH;
  int I_7;
  int I1_6;
  int J_3;
  int I_6;
  int J_2;
  int I_5;
  allocator local_e1;
  string local_e0 [36];
  int local_bc;
  int local_b8;
  int I1_5;
  int I1_4;
  int ID2;
  int ID1;
  int I1_3;
  int IM_1;
  int I1_2;
  int I_4;
  int IZ;
  int J_1;
  int I_3;
  int MSTU90;
  int KCD;
  int KCM;
  int iStack_7c;
  bool repeat130;
  int IM;
  int ID;
  int I_2;
  int I_1;
  int I1_1;
  int J;
  int KC_2;
  int KC_1;
  int KC;
  int local_54;
  int I;
  int local_4c;
  int I1;
  int IMAX;
  double PLS [2];
  double PTS [2];
  int local_1c [2];
  int NS [2];
  int MEDIT_local;
  sophia_interface *this_local;
  
  NS[0] = MEDIT;
  unique0x10003541 = this;
  if (((MEDIT < 0) || (3 < MEDIT)) && (MEDIT != 5)) {
    if ((MEDIT < 0xb) || (0xf < MEDIT)) {
      if (MEDIT == 0x10) {
        NS[0] = 0x10;
        psVar8 = this;
        for (IM_1 = 1; IM_1 < this->N + 1; IM_1 = IM_1 + 1) {
          if ((((10 < this->K[0][IM_1 + -1]) && (this->K[0][IM_1 + -1] < 0x15)) &&
              (this->K[3][IM_1 + -1] == 0)) && (iVar3 = IM_1, this->K[4][IM_1 + -1] == 0)) {
            while (I1_3 = iVar3 + 1, I1_3 < this->N + 1) {
              lVar7 = (long)iVar3;
              iVar3 = I1_3;
              if (this->K[2][lVar7] == IM_1) {
                if (this->K[3][IM_1 + -1] == 0) {
                  this->K[3][IM_1 + -1] = I1_3;
                }
                else {
                  this->K[4][IM_1 + -1] = I1_3;
                }
              }
            }
            if (this->K[4][IM_1 + -1] == 0) {
              this->K[4][IM_1 + -1] = this->K[3][IM_1 + -1];
            }
            if (((((this->K[3][IM_1 + -1] == 0) && (ID1 = this->K[2][IM_1 + -1], 0 < ID1)) &&
                 ((ID1 < IM_1 && ((0x14 < this->K[0][ID1 + -1] && (this->K[0][ID1 + -1] < 0x1f))))))
                && (this->K[1][ID1 + -1] == this->K[1][IM_1 + -1])) &&
               (std::abs((int)psVar8), iVar4 = IM_1, iVar3 = IM_1, extraout_XMM0_Qa <= 0.01)) {
              while (ID2 = iVar3 + 1, ID2 < this->N + 1) {
                lVar7 = (long)iVar3;
                iVar3 = ID2;
                if (this->K[2][lVar7] == ID1) {
                  if (this->K[3][IM_1 + -1] == 0) {
                    this->K[3][IM_1 + -1] = ID2;
                  }
                  else {
                    this->K[4][IM_1 + -1] = ID2;
                  }
                }
              }
              if (this->K[4][IM_1 + -1] == 0) {
                this->K[4][IM_1 + -1] = this->K[3][IM_1 + -1];
              }
              if (this->K[3][IM_1 + -1] == 0) {
                I1_4 = ID1;
                I1_5 = ID1;
                iVar3 = ID1;
                while (iVar5 = iVar3, local_b8 = iVar5 + 1, local_b8 < IM_1) {
                  iVar3 = local_b8;
                  if ((((this->K[2][iVar5] == ID1) && (iVar3 = local_b8, 0x14 < this->K[0][iVar5]))
                      && (iVar3 = local_b8, this->K[0][iVar5] < 0x1f)) &&
                     (I1_5 = local_b8, iVar3 = local_b8, I1_4 == ID1)) {
                    I1_4 = local_b8;
                    iVar3 = local_b8;
                  }
                }
                local_bc = IM_1 + 1;
                while (local_bc < this->N + 1) {
                  if ((this->K[2][iVar4] == I1_4) || (this->K[2][iVar4] == I1_5)) {
                    if (this->K[3][IM_1 + -1] == 0) {
                      this->K[3][IM_1 + -1] = local_bc;
                    }
                    else {
                      this->K[4][IM_1 + -1] = local_bc;
                    }
                  }
                  IM_1 = IM_1 + 1;
                }
                if (this->K[4][IM_1 + -1] == 0) {
                  this->K[4][IM_1 + -1] = this->K[3][IM_1 + -1];
                }
              }
            }
          }
        }
      }
      else if (MEDIT == 0x15) {
        if (this->N * 2 < MSTU[3]) {
          for (I_6 = 0; I_6 < this->N; I_6 = I_6 + 1) {
            for (J_3 = 0; J_3 < 5; J_3 = J_3 + 1) {
              this->K[J_3][MSTU[3] - I_6] = this->K[J_3][I_6];
              this->P[J_3][MSTU[3] - I_6] = this->P[J_3][I_6];
              this->V[J_3][MSTU[3] - I_6] = this->V[J_3][I_6];
            }
          }
          MSTU[0x1f] = this->N;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e0,"(LUEDIT:) no more memory left in LUJETS",&local_e1)
          ;
          LUERRM(this,0xb,(string *)local_e0);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        }
      }
      else if (MEDIT == 0x16) {
        for (I1_6 = 0; I1_6 < MSTU[0x1f]; I1_6 = I1_6 + 1) {
          for (I_7 = 0; I_7 < 5; I_7 = I_7 + 1) {
            this->K[I_7][I1_6] = this->K[I_7][MSTU[3] - I1_6];
            this->P[I_7][I1_6] = this->P[I_7][MSTU[3] - I1_6];
            this->V[I_7][I1_6] = this->V[I_7][MSTU[3] - I1_6];
          }
        }
        this->N = MSTU[0x1f];
      }
      else if (MEDIT == 0x17) {
        KH = 0;
        for (IS = 0; IS < this->N; IS = IS + 1) {
          I_8 = this->K[2][IS];
          if ((0 < I_8) && (0x14 < this->K[0][I_8 + -1])) {
            I_8 = 0;
          }
          if (I_8 != 0) break;
          KH = KH + 1;
          if ((10 < this->K[0][IS]) && (this->K[0][IS] < 0x15)) {
            this->K[0][IS] = this->K[0][IS] + -10;
          }
        }
        this->N = KH;
      }
      else if ((MEDIT == 0x1f) || (MEDIT == 0x20)) {
        iVar3 = this->N + MSTU[2];
        dVar9 = ULANGL(this,this->P[0][MSTU[0x3c] + -1],this->P[1][MSTU[0x3c] + -1]);
        LUDBRB(this,1,iVar3,0.0,-dVar9,0.0,0.0,0.0,false);
        iVar3 = this->N + MSTU[2];
        dVar9 = ULANGL(this,this->P[2][MSTU[0x3c] + -1],this->P[0][MSTU[0x3c] + -1]);
        LUDBRB(this,1,iVar3,-dVar9,0.0,0.0,0.0,0.0,false);
        iVar3 = this->N + MSTU[2];
        dVar9 = ULANGL(this,this->P[0][MSTU[0x3c]],this->P[0][MSTU[0x3c]]);
        LUDBRB(this,1,iVar3,0.0,-dVar9,0.0,0.0,0.0,false);
        if (NS[0] != 0x1f) {
          for (KC_3 = 0; KC_3 < 2; KC_3 = KC_3 + 1) {
            local_1c[KC_3] = 0;
            PLS[(long)KC_3 + 1] = 0.0;
            (&I1 + (long)KC_3 * 2)[0] = 0;
            (&I1 + (long)KC_3 * 2)[1] = 0;
          }
          for (IS_1 = 0; IS_1 < this->N; IS_1 = IS_1 + 1) {
            if (((0 < this->K[0][IS_1]) && (this->K[0][IS_1] < 0xb)) &&
               ((MSTU[0x28] < 2 ||
                ((((iVar3 = LUCOMP(this,this->K[1][IS_1]), iVar3 != 0 && (iVar3 != 0xc)) &&
                  (iVar3 != 0xe)) &&
                 (((iVar3 != 0x10 && (iVar3 != 0x12)) &&
                  ((MSTU[0x28] < 3 ||
                   ((KCHG[1][iVar3 + -1] != 0 || (iVar3 = LUCHGE(this,this->K[1][IS_1]), iVar3 != 0)
                    ))))))))))) {
              iVar3 = 1;
              if (this->P[2][IS_1] < 0.0) {
                iVar3 = 2;
              }
              local_1c[iVar3 + -1] = local_1c[iVar3 + -1] + 1;
              dVar9 = sqrt(this->P[0][IS_1] * this->P[0][IS_1] + this->P[1][IS_1] * this->P[1][IS_1]
                          );
              PLS[(long)(iVar3 + -1) + 1] = dVar9 + PLS[(long)(iVar3 + -1) + 1];
            }
          }
          if ((double)local_1c[0] * PTS[0] * PTS[0] < (double)local_1c[1] * PLS[1] * PLS[1]) {
            LUDBRB(this,1,this->N + MSTU[2],PARU[0],0.0,0.0,0.0,0.0,false);
          }
          for (IS_2 = 0; IS_2 < this->N; IS_2 = IS_2 + 1) {
            if ((((this->P[2][IS_2] < 0.0) && (0 < this->K[0][IS_2])) && (this->K[0][IS_2] < 0xb))
               && ((MSTU[0x28] < 2 ||
                   (((iVar3 = LUCOMP(this,this->K[1][IS_2]), iVar3 != 0 && (iVar3 != 0xc)) &&
                    (((iVar3 != 0xe && ((iVar3 != 0x10 && (iVar3 != 0x12)))) &&
                     ((MSTU[0x28] < 3 ||
                      ((KCHG[1][iVar3 + -1] != 0 ||
                       (iVar3 = LUCHGE(this,this->K[1][IS_2]), iVar3 != 0)))))))))))) {
              iVar3 = 1;
              if (this->P[0][IS_2] < 0.0) {
                iVar3 = 2;
              }
              *(double *)(&I1 + (long)(iVar3 + -1) * 2) =
                   *(double *)(&I1 + (long)(iVar3 + -1) * 2) - this->P[2][IS_2];
            }
          }
          if (_I1 < PLS[0]) {
            LUDBRB(this,1,this->N + MSTU[2],0.0,PARU[0],0.0,0.0,0.0,false);
          }
        }
      }
    }
    else {
      I_2 = 0;
      for (ID = 0; ID < this->N; ID = ID + 1) {
        this->K[2][ID] = this->K[2][ID] % MSTU[4];
        if (((((MEDIT != 0xb) || (-1 < this->K[0][ID])) && ((MEDIT != 0xc || (this->K[0][ID] != 0)))
             ) && (((MEDIT != 0xd ||
                    (((this->K[0][ID] != 0xb && (this->K[0][ID] != 0xc)) && (this->K[0][ID] != 0xf))
                    )) || (this->K[1][ID] == 0x5e)))) &&
           (((MEDIT != 0xe ||
             (((this->K[0][ID] != 0xd && (this->K[0][ID] != 0xe)) && (this->K[1][ID] != 0x5e)))) &&
            ((MEDIT != 0xf || (this->K[0][ID] < 0x15)))))) {
          I_2 = I_2 + 1;
          this->K[2][ID] = this->K[2][ID] + MSTU[4] * I_2;
        }
      }
      for (IM = 1; iVar3 = MSTU[0x59], IM < this->N + 1; IM = IM + 1) {
        if (((0 < this->K[0][IM + -1]) && (this->K[0][IM + -1] < 0x15)) &&
           (this->K[2][IM + -1] / MSTU[4] != 0)) {
          iStack_7c = IM;
          do {
            bVar2 = false;
            iVar3 = this->K[2][iStack_7c + -1] % MSTU[4];
            if (((MEDIT == 0xd) && (0 < iVar3)) && (iVar3 <= this->N)) {
              if ((((this->K[0][iVar3 + -1] == 0xb) || (this->K[0][iVar3 + -1] == 0xc)) ||
                  (this->K[0][iVar3 + -1] == 0xf)) && (this->K[1][iVar3 + -1] != 0x5e)) {
                bVar2 = true;
                iStack_7c = iVar3;
              }
            }
            else if (((MEDIT == 0xe) && (0 < iVar3)) &&
                    ((iVar3 <= this->N &&
                     (((this->K[0][iVar3 + -1] == 0xd || (this->K[0][iVar3 + -1] == 0xe)) ||
                      (this->K[1][iVar3 + -1] == 0x5e)))))) {
              bVar2 = true;
              iStack_7c = iVar3;
            }
          } while (bVar2);
          this->K[2][IM + -1] = MSTU[4] * (this->K[2][IM + -1] / MSTU[4]);
          if (iVar3 != 0) {
            this->K[2][IM + -1] = this->K[2][iVar3 + -1] / MSTU[4] + this->K[2][IM + -1];
          }
          if (((this->K[0][IM + -1] == 3) || (this->K[0][IM + -1] == 0xd)) ||
             (this->K[0][IM + -1] == 0xe)) {
            uVar1 = (long)this->K[3][IM + -1] / (long)MSTU[4];
            MSTU90 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                          (long)MSTU[4]);
            if ((0 < MSTU90) && (MSTU90 <= MSTU[3])) {
              MSTU90 = this->K[2][MSTU90 + -1] / MSTU[4];
            }
            I_3 = this->K[3][IM + -1] % MSTU[4];
            if ((0 < I_3) && (I_3 <= MSTU[3])) {
              I_3 = this->K[2][I_3 + -1] / MSTU[4];
            }
            this->K[3][IM + -1] =
                 MSTU[4] * MSTU[4] * (this->K[3][IM + -1] / (MSTU[4] * MSTU[4])) + MSTU[4] * MSTU90
                 + I_3;
            uVar1 = (long)this->K[4][IM + -1] / (long)MSTU[4];
            MSTU90 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                          (long)MSTU[4]);
            if ((0 < MSTU90) && (MSTU90 <= MSTU[3])) {
              MSTU90 = this->K[2][MSTU90 + -1] / MSTU[4];
            }
            I_3 = this->K[4][IM + -1] % MSTU[4];
            if ((0 < I_3) && (I_3 <= MSTU[3])) {
              I_3 = this->K[2][I_3 + -1] / MSTU[4];
            }
            this->K[4][IM + -1] =
                 MSTU[4] * MSTU[4] * (this->K[4][IM + -1] / (MSTU[4] * MSTU[4])) + MSTU[4] * MSTU90
                 + I_3;
          }
          else {
            if ((0 < this->K[3][IM + -1]) && (this->K[3][IM + -1] <= MSTU[3])) {
              this->K[3][IM + -1] = this->K[2][this->K[3][IM + -1] + -1] / MSTU[4];
            }
            if ((0 < this->K[4][IM + -1]) && (this->K[4][IM + -1] <= MSTU[3])) {
              this->K[4][IM + -1] = this->K[2][this->K[4][IM + -1] + -1] / MSTU[4];
            }
          }
        }
      }
      I_2 = 0;
      MSTU[0x59] = 0;
      for (IZ = 0; IZ < this->N; IZ = IZ + 1) {
        if (this->K[2][IZ] / MSTU[4] != 0) {
          iVar4 = I_2 + 1;
          for (I_4 = 0; I_4 < 5; I_4 = I_4 + 1) {
            this->K[I_4][I_2] = this->K[I_4][IZ];
            this->P[I_4][I_2] = this->P[I_4][IZ];
            this->V[I_4][I_2] = this->V[I_4][IZ];
          }
          this->K[2][I_2] = this->K[2][I_2] % MSTU[4];
          for (I1_2 = 0; I_2 = iVar4, I1_2 < iVar3; I1_2 = I1_2 + 1) {
            if (IZ + 1 == MSTU[I1_2 + 0x5a]) {
              iVar5 = MSTU[0x59] + 0x5a;
              MSTU[0x59] = MSTU[0x59] + 1;
              MSTU[iVar5] = iVar4;
              PARU[MSTU[0x59] + 0x59] = PARU[I1_2 + 0x5a];
            }
          }
        }
      }
      if (I_2 < this->N) {
        MSTU[2] = 0;
      }
      if (I_2 < this->N) {
        MSTU[0x45] = 0;
      }
      this->N = I_2;
    }
  }
  else {
    local_4c = this->N;
    if (0 < MSTU[1]) {
      local_4c = MSTU[1];
    }
    local_54 = 1;
    piVar6 = std::max<int>(&local_54,MSTU);
    I = *piVar6 + -1;
    KC_1 = 1;
    piVar6 = std::max<int>(&KC_1,MSTU);
    for (KC = *piVar6 + -1; KC < local_4c; KC = KC + 1) {
      if ((this->K[0][KC] != 0) && (this->K[0][KC] < 0x15)) {
        if (NS[0] == 1) {
          if (10 < this->K[0][KC]) goto LAB_00119411;
        }
        else if (NS[0] == 2) {
          if (((((10 < this->K[0][KC]) || (KC_2 = LUCOMP(this,this->K[1][KC]), KC_2 == 0)) ||
               (KC_2 == 0xc)) || ((KC_2 == 0xe || (KC_2 == 0x10)))) || (KC_2 == 0x12))
          goto LAB_00119411;
        }
        else if (NS[0] == 3) {
          if ((10 < this->K[0][KC]) || (J = LUCOMP(this,this->K[1][KC]), J == 0)) goto LAB_00119411;
          if (KCHG[1][J + -1] == 0) {
            iVar3 = LUCHGE(this,this->K[1][KC]);
joined_r0x001192f1:
            if (iVar3 == 0) goto LAB_00119411;
          }
        }
        else if (NS[0] == 5) {
          if (((this->K[0][KC] == 0xd) || (this->K[0][KC] == 0xe)) ||
             (I1_1 = LUCOMP(this,this->K[1][KC]), I1_1 == 0)) goto LAB_00119411;
          if (10 < this->K[0][KC]) {
            iVar3 = KCHG[1][I1_1 + -1];
            goto joined_r0x001192f1;
          }
        }
        for (I_1 = 0; I_1 < 5; I_1 = I_1 + 1) {
          this->K[I_1][I] = this->K[I_1][KC];
          this->P[I_1][I] = this->P[I_1][KC];
          this->V[I_1][I] = this->V[I_1][KC];
        }
        this->K[2][I] = 0;
        I = I + 1;
      }
LAB_00119411:
    }
    if (I < this->N) {
      MSTU[2] = 0;
    }
    if (I < this->N) {
      MSTU[0x45] = 0;
    }
    this->N = I;
  }
  return;
}

Assistant:

void sophia_interface::LUEDIT(int MEDIT) {
// Purpose: to perform global manipulations on the event record,
// in particular to exclude unstable or undetectable partons/particles.
    int NS[2];
    double PTS[2];
    double PLS[2];

    // Remove unwanted partons/particles.
    if ((MEDIT >= 0 && MEDIT <= 3) || MEDIT == 5) {
        int IMAX = N;
        if (MSTU[1] > 0) IMAX = MSTU[1];
        int I1 = std::max(1, MSTU[0]) - 1;
        for (int I = std::max(1, MSTU[0]) - 1; I < IMAX; ++I) {
            if (K[0][I] == 0 || K[0][I] > 20) continue;
            if (MEDIT == 1) {
                if (K[0][I] > 10) continue;
            } else if (MEDIT == 2) {
                if (K[0][I] > 10) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
            } else if (MEDIT == 3) {
                if (K[0][I] > 10) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0) continue;
                if (KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
            } else if (MEDIT == 5) {
                if (K[0][I] == 13 || K[0][I] == 14) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0) continue;
                if (K[0][I] >= 11 && KCHG[1][KC - 1] == 0) continue;
            }

            // Pack remaining partons/particles. Origin no longer known.
            I1++;
            for (int J = 0; J < 5; ++J) {
                K[J][I1 - 1] = K[J][I];
                P[J][I1 - 1] = P[J][I];
                V[J][I1 - 1] = V[J][I];
            }
            K[2][I1 - 1] = 0;
        } 
        if (I1 < N) MSTU[2] = 0;
        if (I1 < N) MSTU[69] = 0;
        N = I1;
 
        // Selective removal of class of entries. New position of retained. 
        } else if (MEDIT >= 11 && MEDIT <= 15) {
            int I1 = 0;
            for (int I = 0; I < N; ++I) {
                K[2][I] = K[2][I] % MSTU[4];
                if (MEDIT == 11 && K[0][I] < 0) continue;
                if (MEDIT == 12 && K[0][I] == 0) continue;
                if (MEDIT == 13 && (K[0][I] == 11 || K[0][I] == 12 || K[0][I] == 15) && K[1][I] != 94) continue;
                if (MEDIT == 14 && (K[0][I] == 13 || K[0][I] == 14 || K[1][I] == 94)) continue;
                if (MEDIT == 15 && K[0][I] >= 21) continue;
                I1++;
                K[2][I] = K[2][I] + MSTU[4] * I1;
            }

            // Find new event history information and replace old.
            for (int I = 1; I < N + 1; ++I) { 
                if (K[0][I - 1] <= 0 || K[0][I - 1] > 20 || K[2][I - 1] / MSTU[4] == 0) continue;
                int ID = I;
                int IM = 0;
                bool repeat130 = false;
                do {
                    repeat130 = false;
                    IM = K[2][ID - 1] % MSTU[4];
                    if (MEDIT == 13 && IM > 0 && IM <= N) {
                        if ((K[0][IM - 1] == 11 || K[0][IM - 1] == 12 || K[0][IM - 1] == 15) && K[1][IM - 1] != 94) {
                            ID = IM;
                            repeat130 = true;
                            continue;
                        }
                    } else if (MEDIT == 14 && IM > 0 && IM <= N) {
                        if (K[0][IM - 1] == 13 || K[0][IM - 1] == 14 || K[1][IM - 1] == 94) {
                            ID = IM;
                            repeat130 = true;
                            continue;
                        }
                    }
                } while (repeat130);

                K[2][I - 1] = MSTU[4] * (K[2][I - 1] / MSTU[4]);
                if (IM != 0) K[2][I - 1] += K[2][IM - 1] / MSTU[4];
                if (K[0][I - 1] != 3 && K[0][I - 1] != 13 && K[0][I - 1] != 14) {
                    if (K[3][I - 1] > 0 && K[3][I - 1] <= MSTU[3]) K[3][I - 1] = K[2][K[3][I - 1] - 1] / MSTU[4];
                    if (K[4][I - 1] > 0 && K[4][I - 1] <= MSTU[3]) K[4][I - 1] = K[2][K[4][I - 1] - 1] / MSTU[4];
                } else {
                    int KCM = (K[3][I - 1] / MSTU[4]) % MSTU[4];
                    if (KCM > 0 && KCM <= MSTU[3]) KCM = K[2][KCM - 1] / MSTU[4];
                    int KCD = K[3][I - 1] % MSTU[4];
                    if (KCD > 0 && KCD <= MSTU[3]) KCD = K[2][KCD - 1] / MSTU[4];
                    K[3][I - 1] = MSTU[4] * MSTU[4] * (K[3][I - 1] / (MSTU[4] * MSTU[4])) + MSTU[4] * KCM + KCD;
                    KCM = (K[4][I - 1] / MSTU[4]) % MSTU[4];
                    if (KCM > 0 && KCM <= MSTU[3]) KCM = K[2][KCM - 1] / MSTU[4];
                    KCD = K[4][I - 1] % MSTU[4];
                    if (KCD > 0 && KCD <= MSTU[3]) KCD = K[2][KCD - 1] / MSTU[4];
                    K[4][I - 1] = MSTU[4] * MSTU[4] * (K[4][I - 1] / (MSTU[4] * MSTU[4])) + MSTU[4] * KCM + KCD;
                }
            }

            // Pack remaining entries. 
            I1 = 0;
            int MSTU90 = MSTU[89];
            MSTU[89] = 0;
            for (int I = 0; I < N; ++I) {
                if (K[2][I] / MSTU[4] == 0) continue;
                I1++;
                for (int J = 0; J < 5; ++J) {
                    K[J][I1 - 1] = K[J][I];
                    P[J][I1 - 1] = P[J][I];
                    V[J][I1 - 1] = V[J][I];
                }
                K[2][I1 - 1] = K[2][I1 - 1] % MSTU[4]; 
                for (int IZ = 0; IZ < MSTU90; ++IZ) {
                    if (I + 1 == MSTU[90 + IZ]) {
                        MSTU[89]++;
                        MSTU[89 + MSTU[89]] = I1;
                        PARU[89 + MSTU[89]] = PARU[90 + IZ];
                    }
                }
            }
            if (I1 < N) MSTU[2] = 0;
            if (I1 < N) MSTU[69] = 0;
            N = I1;

        // Fill in some missing daughter pointers (lost in colour flow). 
        } else if (MEDIT == 16) {
            for (int I = 1; I < N + 1; ++I) {
                if (K[0][I - 1] <= 10 || K[0][I - 1] > 20) continue;
                if (K[3][I - 1] != 0 || K[4][I - 1] != 0) continue;

                // Find daughters who point to mother.
                for (int I1 = I + 1; I1 < N + 1; ++I1) {
                    if (K[2][I1 - 1] != I) {
                        // do nothing
                    } else if (K[3][I - 1] == 0) {
                        K[3][I - 1] = I1;
                    } else {
                        K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
                if (K[3][I - 1] != 0) continue;

                // Find daughters who point to documentation version of mother.    
                int IM = K[2][I - 1];
                if (IM <= 0 || IM >= I) continue;
                if (K[0][IM - 1] <= 20 || K[0][IM - 1] > 30) continue;
                if (K[1][IM - 1] != K[1][I - 1] || std::abs(P[4][IM - 1] - P[4][I - 1]) > 1e-2) continue;
                for (int I1 = I + 1; I1 < N + 1; ++I1) {
                    if (K[2][I1 - 1] != IM) {
                        // do nothing
                    } else if (K[3][I - 1] == 0) {
                      K[3][I - 1] = I1;
                    } else {
                      K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
                if (K[3][I - 1] != 0) continue;

                // Find daughters who point to documentation daughters who,
                // in their turn, point to documentation mother.
                int ID1 = IM;
                int ID2 = IM;
                for (int I1 = IM + 1; I1 < I; ++I1) {
                    if (K[2][I1 - 1] == IM && K[0][I1 - 1] > 20 && K[0][I1 - 1] <= 30) {
                        ID2 = I1;
                        if (ID1 == IM) ID1 = I1;
                    }
                }
                for (int I1 = I + 1; I1 < N + 1; ++I) {
                    if (K[2][I1 - 1] != ID1 && K[2][I1 - 1] != ID2) {
                    } else if (K[3][I - 1] == 0) {
                        K[3][I - 1] = I1;
                    } else {
                        K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
            }

        // Save top entries at bottom of LUJETS common block.
        } else if (MEDIT == 21) {
            if (2 * N >= MSTU[3]) {
                LUERRM(11, "(LUEDIT:) no more memory left in LUJETS");
                return;
            }
            for (int I = 0; I < N; ++I) {
                for (int J = 0; J < 5; ++J) {
                    K[J][MSTU[3] - I] = K[J][I];
                    P[J][MSTU[3] - I] = P[J][I];
                    V[J][MSTU[3] - I] = V[J][I];
                }
            }
            MSTU[31] = N;

        // Restore bottom entries of common block LUJETS to top.
        } else if (MEDIT == 22) {
            for (int I = 0; I < MSTU[31]; ++I) {
                for (int J = 0; J < 5; ++J) {
                    K[J][I] = K[J][MSTU[3] - I];
                    P[J][I] = P[J][MSTU[3] - I];
                    V[J][I] = V[J][MSTU[3] - I];
                }
            }
            N = MSTU[31];

        // Mark primary entries at top of common block LUJETS as untreated.
        } else if (MEDIT == 23) {
            int I1 = 0;
            for (int I = 0; I < N; ++I) {
                int KH = K[2][I];
                if (KH >= 1) {
                    if (K[0][KH - 1] > 20) KH = 0;
                }
                if (KH != 0) break;
                I1++;
                if (K[0][I] > 10 && K[0][I] <= 20) K[0][I] -= 10;
            }
            N = I1;

        // Place largest axis along z axis and second largest in xy plane.
        } else if (MEDIT == 31 || MEDIT == 32) {
            LUDBRB(1, N + MSTU[2], 0., -ULANGL(P[0][MSTU[60] - 1], P[1][MSTU[60] - 1]), 0., 0., 0.);
            LUDBRB(1, N + MSTU[2], -ULANGL(P[2][MSTU[60] - 1], P[0][MSTU[60] - 1]), 0., 0., 0., 0.);
            LUDBRB(1, N + MSTU[2], 0., -ULANGL(P[0][MSTU[60]], P[0][MSTU[60]]), 0., 0., 0.);
            if (MEDIT == 31) return;
 
            // Rotate to put slim jet along +z axis. 
            for (int IS = 0; IS < 2; ++IS) {
                NS[IS] = 0;
                PTS[IS] = 0.;
                PLS[IS] = 0.;
            }
            for (int I = 0; I < N; ++I) {
                if (K[0][I] <= 0 || K[0][I] > 10) continue;
                if (MSTU[40] >= 2) {
                    int KC = LUCOMP(K[1][I]);
                    if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
                    if (MSTU[40] >= 3 && KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
                }
                int IS = (P[2][I] < 0)? 2 : 1;  // this is the most meaningful expression I could derive from: int IS = 2. - SIGN(0.5, P[2][I])
                NS[IS - 1]++;
                PTS[IS - 1] += std::sqrt(P[0][I] * P[0][I] + P[1][I] * P[1][I]);
            }
            if (NS[0] * PTS[1] * PTS[1] < NS[1] * PTS[0] * PTS[0]) LUDBRB(1, N + MSTU[2], PARU[0], 0., 0., 0., 0.);

            // Rotate to put second largest jet into -z,+x quadrant.
            for (int I = 0; I < N; ++I) {
                if (P[2][I] >= 0.) continue;
                if (K[0][I] <= 0 || K[0][I] > 10) continue;
                if (MSTU[40] >= 2) {
                    int KC = LUCOMP(K[1][I]);
                    if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
                    if (MSTU[40] >= 3 && KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
                }
                int IS = (P[0][I] < 0)? 2 : 1;  // this is the most meaningful expression I could derive from: int IS = 2. - SIGN(0.5, P[2][I])
                PLS[IS - 1] -= P[2][I];
            }
            if (PLS[1] > PLS[0]) LUDBRB(1, N + MSTU[2], 0., PARU[0], 0., 0., 0.);
      }
      return;
}